

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArraySet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArraySet *curr)

{
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Literal *pLVar4;
  element_type *peVar5;
  size_t sVar6;
  Literal local_180;
  Literal local_168;
  uintptr_t local_150;
  HeapType local_148;
  uintptr_t uStack_140;
  undefined1 auStack_138 [8];
  Field field;
  undefined1 local_118 [4];
  Index i;
  shared_ptr<wasm::GCData> data;
  Flow value;
  Flow index;
  undefined1 local_68 [8];
  Flow ref;
  ArraySet *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&value.breakTo.super_IString.str._M_str,pEVar3,
          *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
    bVar1 = Flow::breaking((Flow *)&value.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&value.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      visit((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
            pEVar3,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20));
      bVar1 = Flow::breaking((Flow *)&data.
                                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,
                   (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      }
      else {
        Flow::getSingleValue((Flow *)local_68);
        wasm::Literal::getGCData((Literal *)local_118);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_118);
        if (!bVar1) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        pLVar4 = Flow::getSingleValue((Flow *)&value.breakTo.super_IString.str._M_str);
        uVar2 = wasm::Literal::geti32(pLVar4);
        peVar5 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_118);
        sVar6 = SmallVector<wasm::Literal,_1UL>::size
                          (&(peVar5->values).super_SmallVector<wasm::Literal,_1UL>);
        if (sVar6 <= uVar2) {
          (*this->_vptr_ExpressionRunner[2])(this,"array oob");
        }
        local_150 = (uintptr_t)
                    wasm::Type::getHeapType
                              ((Type *)(*(long *)(ref.breakTo.super_IString.str._M_str + 0x10) + 8))
        ;
        HeapType::getArray(&local_148);
        auStack_138 = (undefined1  [8])local_148.id;
        field.type.id = uStack_140;
        pLVar4 = Flow::getSingleValue
                           ((Flow *)&data.
                                     super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
        wasm::Literal::Literal(&local_180,pLVar4);
        truncateForPacking(&local_168,this,&local_180,(Field *)auStack_138);
        peVar5 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_118);
        pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                           (&(peVar5->values).super_SmallVector<wasm::Literal,_1UL>,(ulong)uVar2);
        wasm::Literal::operator=(pLVar4,&local_168);
        wasm::Literal::~Literal(&local_168);
        wasm::Literal::~Literal(&local_180);
        Flow::Flow(__return_storage_ptr__);
        std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)local_118);
      }
      Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    Flow::~Flow((Flow *)&value.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArraySet(ArraySet* curr) {
    NOTE_ENTER("ArraySet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    Index i = index.getSingleValue().geti32();
    if (i >= data->values.size()) {
      trap("array oob");
    }
    auto field = curr->ref->type.getHeapType().getArray().element;
    data->values[i] = truncateForPacking(value.getSingleValue(), field);
    return Flow();
  }